

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O3

ResultPointsAndTransitions *
ZXing::DataMatrix::TransitionsBetween
          (ResultPointsAndTransitions *__return_storage_ptr__,BitMatrix *image,ResultPoint *from,
          ResultPoint *to)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int y;
  int iVar7;
  int iVar9;
  undefined1 auVar8 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  
  iVar7 = (int)(from->super_PointF).x;
  iVar9 = (int)(from->super_PointF).y;
  iVar12 = (int)(to->super_PointF).x;
  iVar14 = (int)(to->super_PointF).y;
  iVar10 = iVar12 - iVar7 >> 0x1f;
  iVar11 = iVar14 - iVar9 >> 0x1f;
  uVar1 = CONCAT44(iVar14 - iVar9,iVar12 - iVar7) ^ CONCAT44(iVar11,iVar10);
  uVar15 = (int)uVar1 - iVar10;
  uVar16 = (int)(uVar1 >> 0x20) - iVar11;
  iVar13 = iVar12;
  uVar2 = uVar16;
  uVar3 = uVar15;
  iVar10 = iVar9;
  iVar11 = iVar7;
  if (uVar16 <= uVar15) {
    iVar13 = iVar14;
    iVar14 = iVar12;
    uVar2 = uVar15;
    uVar3 = uVar16;
    iVar10 = iVar7;
    iVar11 = iVar9;
  }
  bVar4 = BitMatrix::get(image,iVar7,iVar9);
  iVar7 = 0;
  if (iVar10 != iVar14) {
    auVar8._0_4_ = -(uint)(iVar11 < iVar13);
    auVar8._4_4_ = auVar8._0_4_;
    auVar8._8_4_ = -(uint)(iVar10 < iVar14);
    auVar8._12_4_ = -(uint)(iVar10 < iVar14);
    uVar6 = movmskpd(0,auVar8);
    iVar9 = -(uVar2 >> 1);
    iVar7 = 0;
    do {
      y = iVar11;
      iVar12 = iVar10;
      if (uVar15 < uVar16) {
        y = iVar10;
        iVar12 = iVar11;
      }
      bVar5 = BitMatrix::get(image,iVar12,y);
      iVar7 = (uint)(byte)(bVar4 ^ bVar5) + iVar7;
      if ((bVar4 ^ bVar5) == 0) {
        bVar5 = bVar4;
      }
      bVar4 = bVar5;
      bVar5 = SCARRY4(iVar9,uVar3);
      iVar9 = iVar9 + uVar3;
      if (iVar9 != 0 && bVar5 == iVar9 < 0) {
        if (iVar11 == iVar13) break;
        iVar11 = iVar11 + ((uVar6 & 1) - 1 | 1);
        iVar9 = iVar9 - uVar2;
      }
      iVar10 = iVar10 + ((uVar6 >> 1 & 0x7f) - 1 | 1);
    } while (iVar14 != iVar10);
  }
  __return_storage_ptr__->from = from;
  __return_storage_ptr__->to = to;
  __return_storage_ptr__->transitions = iVar7;
  return (ResultPointsAndTransitions *)to;
}

Assistant:

static ResultPointsAndTransitions TransitionsBetween(const BitMatrix& image, const ResultPoint& from,
													 const ResultPoint& to)
{
	// See QR Code Detector, sizeOfBlackWhiteBlackRun()
	int fromX = static_cast<int>(from.x());
	int fromY = static_cast<int>(from.y());
	int toX = static_cast<int>(to.x());
	int toY = static_cast<int>(to.y());
	bool steep = std::abs(toY - fromY) > std::abs(toX - fromX);
	if (steep) {
		std::swap(fromX, fromY);
		std::swap(toX, toY);
	}

	int dx = std::abs(toX - fromX);
	int dy = std::abs(toY - fromY);
	int error = -dx / 2;
	int ystep = fromY < toY ? 1 : -1;
	int xstep = fromX < toX ? 1 : -1;
	int transitions = 0;
	bool inBlack = image.get(steep ? fromY : fromX, steep ? fromX : fromY);
	for (int x = fromX, y = fromY; x != toX; x += xstep) {
		bool isBlack = image.get(steep ? y : x, steep ? x : y);
		if (isBlack != inBlack) {
			transitions++;
			inBlack = isBlack;
		}
		error += dy;
		if (error > 0) {
			if (y == toY) {
				break;
			}
			y += ystep;
			error -= dx;
		}
	}
	return ResultPointsAndTransitions{ &from, &to, transitions };
}